

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O1

void * Kernel::FlatTerm::operator_new(size_t sz,uint num)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = 0x10;
  if (num != 0) {
    uVar2 = (ulong)(num - 1) * 8 + 0x1f & 0xfffffffffffffff0;
  }
  if (uVar2 == 0) {
    pvVar1 = ::Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    return pvVar1;
  }
  if (uVar2 < 0x11) {
    pvVar1 = ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    return pvVar1;
  }
  if (uVar2 < 0x19) {
    pvVar1 = ::Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    return pvVar1;
  }
  if (uVar2 < 0x21) {
    pvVar1 = ::Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    return pvVar1;
  }
  if (uVar2 < 0x31) {
    pvVar1 = ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    return pvVar1;
  }
  if (uVar2 < 0x41) {
    pvVar1 = ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    return pvVar1;
  }
  pvVar1 = ::operator_new(uVar2,0x10);
  return pvVar1;
}

Assistant:

void* FlatTerm::operator new(size_t sz,unsigned num)
{
  ASS_GE(num,0);
  ASS_EQ(sz, sizeof(FlatTerm));

  //one entry is already accounted for in the size of the FlatTerm object
  size_t size = sizeof(FlatTerm);
  if (num > 0) {
    size += (num-1)*sizeof(Entry);
  }

  return ALLOC_KNOWN(size,"FlatTerm");
}